

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_draw_triangle_strip(rf_vec2 *points,int points_count,rf_color color)

{
  _Bool _Var1;
  ulong uVar2;
  ulong uVar3;
  rf_int i;
  ulong uVar4;
  
  if (2 < points_count) {
    _Var1 = rf_gfx_check_buffer_limit(points_count);
    if (_Var1) {
      rf_gfx_draw();
    }
    rf_gfx_begin(RF_TRIANGLES);
    rf_gfx_color4ub(color.r,color.g,color.b,color.a);
    for (uVar4 = 2; uVar4 < (uint)points_count; uVar4 = uVar4 + 1) {
      rf_gfx_vertex2f(points[uVar4].x,points[uVar4].y);
      uVar2 = (ulong)(uint)((int)uVar4 * 8);
      uVar3 = (ulong)((uVar4 & 1) == 0) << 3;
      rf_gfx_vertex2f(*(float *)((long)&points[uVar4].x + (uVar2 | 0xfffffffffffffff0)),
                      *(float *)((long)&points[uVar4].x + (uVar2 | 0xfffffffffffffff4)));
      rf_gfx_vertex2f(*(float *)((long)&points[uVar4].x + (uVar3 | 0xfffffffffffffff0)),
                      *(float *)((long)&points[uVar4].x + (uVar3 | 0xfffffffffffffff4)));
    }
    rf_gfx_end();
    return;
  }
  return;
}

Assistant:

RF_API void rf_draw_triangle_strip(rf_vec2 *points, int points_count, rf_color color)
{
    if (points_count >= 3)
    {
        if (rf_gfx_check_buffer_limit(points_count)) rf_gfx_draw();

        rf_gfx_begin(RF_TRIANGLES);
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);

        for (rf_int i = 2; i < points_count; i++)
        {
            if ((i%2) == 0)
            {
                rf_gfx_vertex2f(points[i].x, points[i].y);
                rf_gfx_vertex2f(points[i - 2].x, points[i - 2].y);
                rf_gfx_vertex2f(points[i - 1].x, points[i - 1].y);
            }
            else
            {
                rf_gfx_vertex2f(points[i].x, points[i].y);
                rf_gfx_vertex2f(points[i - 1].x, points[i - 1].y);
                rf_gfx_vertex2f(points[i - 2].x, points[i - 2].y);
            }
        }
        rf_gfx_end();
    }
}